

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O3

void __thiscall cbtDbvt::optimizeIncremental(cbtDbvt *this,int passes)

{
  cbtDbvtNode *pcVar1;
  cbtDbvtNode *pcVar2;
  cbtDbvtNode *pcVar3;
  cbtDbvtNode *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  cbtDbvtNode *leaf;
  uint uVar13;
  ulong uVar14;
  cbtDbvt *pcVar15;
  
  if (passes < 0) {
    passes = this->m_leaves;
  }
  if (0 < passes && this->m_root != (cbtDbvtNode *)0x0) {
    do {
      leaf = this->m_root;
      if ((leaf->field_2).childs[1] != (cbtDbvtNode *)0x0) {
        uVar12 = 0;
        do {
          pcVar1 = leaf->parent;
          if (leaf < pcVar1) {
            pcVar2 = (pcVar1->field_2).childs[1];
            pcVar3 = pcVar1->parent;
            pcVar15 = this;
            if (pcVar3 != (cbtDbvtNode *)0x0) {
              pcVar15 = (cbtDbvt *)
                        ((long)(&pcVar3->volume + 1) +
                        ((ulong)((pcVar3->field_2).childs[1] == pcVar1) + 1) * 8);
            }
            uVar14 = (ulong)(pcVar2 != leaf);
            pcVar4 = *(cbtDbvtNode **)((long)(&pcVar1->volume + 1) + (uVar14 + 1) * 8);
            pcVar15->m_root = leaf;
            pcVar4->parent = leaf;
            pcVar1->parent = leaf;
            leaf->parent = pcVar3;
            (pcVar1->field_2).childs[0] = (leaf->field_2).childs[0];
            (pcVar1->field_2).childs[1] = (leaf->field_2).childs[1];
            (leaf->field_2).childs[0]->parent = pcVar1;
            (leaf->field_2).childs[1]->parent = pcVar1;
            *(cbtDbvtNode **)((long)(&leaf->volume + 1) + ((ulong)(pcVar2 == leaf) + 1) * 8) =
                 pcVar1;
            *(cbtDbvtNode **)((long)(&leaf->volume + 1) + (uVar14 + 1) * 8) = pcVar4;
            uVar5 = *(undefined8 *)(pcVar1->volume).mi.m_floats;
            uVar6 = *(undefined8 *)((pcVar1->volume).mi.m_floats + 2);
            uVar7 = *(undefined8 *)(pcVar1->volume).mx.m_floats;
            uVar8 = *(undefined8 *)((pcVar1->volume).mx.m_floats + 2);
            uVar9 = *(undefined8 *)((leaf->volume).mi.m_floats + 2);
            uVar10 = *(undefined8 *)(leaf->volume).mx.m_floats;
            uVar11 = *(undefined8 *)((leaf->volume).mx.m_floats + 2);
            *(undefined8 *)(pcVar1->volume).mi.m_floats = *(undefined8 *)(leaf->volume).mi.m_floats;
            *(undefined8 *)((pcVar1->volume).mi.m_floats + 2) = uVar9;
            *(undefined8 *)(pcVar1->volume).mx.m_floats = uVar10;
            *(undefined8 *)((pcVar1->volume).mx.m_floats + 2) = uVar11;
            *(undefined8 *)(leaf->volume).mi.m_floats = uVar5;
            *(undefined8 *)((leaf->volume).mi.m_floats + 2) = uVar6;
            *(undefined8 *)(leaf->volume).mx.m_floats = uVar7;
            *(undefined8 *)((leaf->volume).mx.m_floats + 2) = uVar8;
            leaf = pcVar1;
          }
          uVar13 = this->m_opath >> uVar12;
          uVar12 = uVar12 + 1 & 0x1f;
          leaf = *(cbtDbvtNode **)((long)(&leaf->volume + 1) + ((ulong)(uVar13 & 1) + 1) * 8);
        } while ((leaf->field_2).childs[1] != (cbtDbvtNode *)0x0);
      }
      update(this,leaf,-1);
      this->m_opath = this->m_opath + 1;
      passes = passes + -1;
    } while (passes != 0);
  }
  return;
}

Assistant:

void cbtDbvt::optimizeIncremental(int passes)
{
	if (passes < 0) passes = m_leaves;
	if (m_root && (passes > 0))
	{
		do
		{
			cbtDbvtNode* node = m_root;
			unsigned bit = 0;
			while (node->isinternal())
			{
				node = sort(node, m_root)->childs[(m_opath >> bit) & 1];
				bit = (bit + 1) & (sizeof(unsigned) * 8 - 1);
			}
			update(node);
			++m_opath;
		} while (--passes);
	}
}